

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

void __thiscall QCss::Declaration::brushValues(Declaration *this,QBrush *c,QPalette *pal)

{
  _Head_base<0UL,_QBrushData_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  ColorRole cr;
  P _a;
  QMetaType QVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  QBrush *pQVar7;
  QBrush *pQVar8;
  DeclarationData *pDVar9;
  long lVar10;
  undefined1 *puVar11;
  uint uVar12;
  long in_FS_OFFSET;
  undefined1 local_88 [16];
  QArrayDataPointer<QVariant> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar9 = (this->d).d.ptr;
  uVar12 = 0x1f;
  if (*(ulong *)&(pDVar9->parsed).d.field_0x18 < 4) {
LAB_005d9d58:
    local_78.d = (Data *)0x0;
    local_78.ptr = (QVariant *)0x0;
    local_78.size = 0;
    if ((pDVar9->values).d.size == 0) {
      puVar11 = (undefined1 *)0x0;
    }
    else {
      lVar10 = 0;
      puVar11 = (undefined1 *)0x0;
      pQVar7 = c;
      do {
        if ((uVar12 >> ((uint)puVar11 & 0x1f) & 1) != 0) {
          local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          parseBrushValue((Value *)local_88,
                          (QPalette *)((long)&((pDVar9->values).d.ptr)->type + lVar10));
          if (local_88._12_4_ == 3) {
            local_58.shared = (PrivateShared *)0x0;
            local_58._8_8_ = (undefined1 *)0x0;
            local_58._16_8_ = (undefined1 *)0x0;
            local_40 = 2;
LAB_005d9e76:
            QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                      ((QMovableArrayOps<QVariant> *)&local_78,local_78.size,(QVariant *)&local_58);
            QList<QVariant>::end((QList<QVariant> *)&local_78);
            ::QVariant::~QVariant((QVariant *)&local_58);
            QBrush::operator=(pQVar7,(QBrush *)local_88);
          }
          else {
            if (local_88._12_4_ != 2) {
              ::QVariant::QVariant((QVariant *)&local_58,(QMetaType)0x7d4418,(Value *)local_88);
              goto LAB_005d9e76;
            }
            if (_DAT_0080e94c == 0) {
              QMetaType::registerHelper
                        ((QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType)
              ;
            }
            ::QVariant::moveConstruct
                      ((QMetaTypeInterface *)&local_58,
                       &QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType);
            QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                      ((QMovableArrayOps<QVariant> *)&local_78,local_78.size,(QVariant *)&local_58);
            QList<QVariant>::end((QList<QVariant> *)&local_78);
            ::QVariant::~QVariant((QVariant *)&local_58);
            pQVar8 = QPalette::brush(pal,Current,local_88._8_4_);
            QBrush::operator=(pQVar7,((pQVar8->d)._M_t.
                                      super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>
                                      .super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->
                                     color);
          }
          QBrush::~QBrush((QBrush *)local_88);
          pDVar9 = (this->d).d.ptr;
        }
        puVar11 = puVar11 + 1;
        puVar6 = (undefined1 *)(pDVar9->values).d.size;
        if ((undefined1 *)0x3 < puVar6) {
          puVar6 = (undefined1 *)0x4;
        }
        lVar10 = lVar10 + 0x28;
        pQVar7 = pQVar7 + 1;
      } while (puVar11 < puVar6);
    }
    if ((uVar12 & 0x10) != 0) {
      ::QVariant::QVariant((QVariant *)&local_58,(QList_conflict *)&local_78);
      ::QVariant::operator=(&((this->d).d.ptr)->parsed,(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_78);
LAB_005d9f23:
    switch((ulong)puVar11 & 0xffffffff) {
    case 0:
      goto switchD_005d9f43_caseD_0;
    case 1:
      pQVar7 = QBrush::operator=(c + 1,c);
      pQVar7 = QBrush::operator=(c + 2,pQVar7);
      break;
    case 2:
      QBrush::operator=(c + 2,c);
    case 3:
      pQVar7 = c + 1;
      break;
    default:
      goto switchD_005d9f43_default;
    }
    QBrush::operator=(c + 3,pQVar7);
  }
  else {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toList();
    if ((undefined1 *)local_58._16_8_ != (undefined1 *)0x0) {
      lVar10 = 0;
      puVar11 = (undefined1 *)0x0;
      uVar12 = 0;
      pQVar7 = c;
      do {
        iVar3 = ::QVariant::typeId((QVariant *)(local_58._8_8_ + lVar10));
        if (iVar3 == 0x1002) {
          local_78.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
          pQVar8 = (QBrush *)(local_58._8_8_ + lVar10);
          local_88._0_8_ =
               *(ulong *)((undefined1 *)(local_58._8_8_ + 0x18) + lVar10) & 0xfffffffffffffffc;
          bVar2 = comparesEqual((QMetaType *)local_88,(QMetaType *)&local_78);
          if (bVar2) {
            if ((*(byte *)&pQVar8[3].d._M_t.
                           super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 1) != 0) {
              _Var1._M_head_impl =
                   (pQVar8->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t
                   .super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                   super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
              pQVar8 = (QBrush *)
                       ((long)&(_Var1._M_head_impl)->transform +
                       (long)(int)(_Var1._M_head_impl)->style + 0xffffffffffffffe8U);
            }
            QBrush::QBrush((QBrush *)local_88,pQVar8);
          }
          else {
            local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QBrush::QBrush((QBrush *)local_88);
            QVar4.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
            if ((*(byte *)&pQVar8[3].d._M_t.
                           super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 1) != 0) {
              _Var1._M_head_impl =
                   (pQVar8->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t
                   .super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                   super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
              pQVar8 = (QBrush *)
                       ((long)&(_Var1._M_head_impl)->transform +
                       (long)(int)(_Var1._M_head_impl)->style + 0xffffffffffffffe8U);
            }
            QMetaType::convert(QVar4,pQVar8,(QMetaType)local_78.d,(QBrush *)local_88);
          }
          _Var1._M_head_impl =
               (pQVar7->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
          (pQVar7->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
          super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
          super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_88._0_8_;
          local_88._0_8_ = _Var1._M_head_impl;
          QBrush::~QBrush((QBrush *)local_88);
        }
        else {
          iVar3 = ::QVariant::typeId((QVariant *)(local_58._8_8_ + lVar10));
          if (iVar3 == 2) {
            cr = ::QVariant::toInt((bool *)(local_58._8_8_ + lVar10));
            pQVar8 = QPalette::brush(pal,Current,cr);
            QBrush::operator=(pQVar7,((pQVar8->d)._M_t.
                                      super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>
                                      .super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->
                                     color);
          }
          else {
            uVar12 = uVar12 | 1 << ((uint)puVar11 & 0x1f);
          }
        }
        puVar11 = puVar11 + 1;
        uVar5 = local_58._16_8_;
        if ((undefined1 *)0x3 < (ulong)local_58._16_8_) {
          uVar5 = (undefined1 *)0x4;
        }
        lVar10 = lVar10 + 0x20;
        pQVar7 = pQVar7 + 1;
      } while (puVar11 < (ulong)uVar5);
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_58);
      if (uVar12 != 0) {
        pDVar9 = (this->d).d.ptr;
        goto LAB_005d9d58;
      }
      goto LAB_005d9f23;
    }
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_58);
switchD_005d9f43_caseD_0:
    QBrush::QBrush((QBrush *)&local_58.shared);
    _Var1._M_head_impl =
         c[3].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
    c[3].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_58.shared;
    local_58.shared = (PrivateShared *)_Var1._M_head_impl;
    pQVar7 = QBrush::operator=(c + 2,c + 3);
    pQVar7 = QBrush::operator=(c + 1,pQVar7);
    QBrush::operator=(c,pQVar7);
    QBrush::~QBrush((QBrush *)&local_58.shared);
  }
switchD_005d9f43_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Declaration::brushValues(QBrush *c, const QPalette &pal) const
{
    int needParse = 0x1f; // bits 0..3 say if we should parse the corresponding value.
                          // the bit 4 say we need to update d->parsed
    int i = 0;
    if (d->parsed.isValid()) {
        needParse = 0;
        Q_ASSERT(d->parsed.metaType() == QMetaType::fromType<QList<QVariant>>());
        QList<QVariant> v = d->parsed.toList();
        for (i = 0; i < qMin(v.size(), 4); i++) {
            if (v.at(i).userType() == QMetaType::QBrush) {
                c[i] = qvariant_cast<QBrush>(v.at(i));
            } else if (v.at(i).userType() == QMetaType::Int) {
                c[i] = pal.color((QPalette::ColorRole)(v.at(i).toInt()));
            } else {
                needParse |= (1<<i);
            }
        }
    }
    if (needParse != 0) {
        QList<QVariant> v;
        for (i = 0; i < qMin(d->values.size(), 4); i++) {
            if (!(needParse & (1<<i)))
                continue;
            BrushData data = parseBrushValue(d->values.at(i), pal);
            if (data.type == BrushData::Role) {
                v += QVariant::fromValue<int>(data.role);
                c[i] = pal.color((QPalette::ColorRole)(data.role));
            } else {
                if (data.type != BrushData::DependsOnThePalette) {
                    v += QVariant::fromValue<QBrush>(data.brush);
                } else {
                    v += QVariant();
                }
                c[i] = data.brush;
            }
        }
        if (needParse & 0x10)
            d->parsed = v;
    }
    if (i == 0) c[0] = c[1] = c[2] = c[3] = QBrush();
    else if (i == 1) c[3] = c[2] = c[1] = c[0];
    else if (i == 2) c[2] = c[0], c[3] = c[1];
    else if (i == 3) c[3] = c[1];
}